

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Own<kj::AppendableFile,_std::nullptr_t> __thiscall kj::newDiskAppendableFile(kj *this,OwnFd *fd)

{
  int iVar1;
  undefined8 *puVar2;
  Own<kj::AppendableFile,_std::nullptr_t> OVar3;
  
  puVar2 = (undefined8 *)operator_new(0x28);
  *puVar2 = &PTR_getFd_0064c018;
  puVar2[1] = &PTR__AppendableFile_0064c068;
  iVar1 = fd->fd;
  *(int *)(puVar2 + 2) = iVar1;
  fd->fd = -1;
  *puVar2 = &PTR_getFd_0064c258;
  puVar2[1] = &DAT_0064c2b8;
  *(int *)(puVar2 + 4) = iVar1;
  *(undefined4 *)((long)puVar2 + 0x24) = 0xffffffff;
  puVar2[3] = &DAT_0064c2e8;
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::DiskAppendableFile>::instance;
  *(undefined8 **)(this + 8) = puVar2;
  OVar3.ptr = (AppendableFile *)0xffffffff;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<AppendableFile> newDiskAppendableFile(kj::OwnFd fd) {
  return heap<DiskAppendableFile>(kj::mv(fd));
}